

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

void __thiscall nite::Font::load(Font *this,string *path,uint size,float thickness)

{
  string *path_00;
  pointer *pppFVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  iterator iVar5;
  void *pvVar6;
  pointer pfVar7;
  undefined8 uVar8;
  bool bVar9;
  FT_Error FVar10;
  int iVar11;
  FT_UInt glyph_index;
  Vec2 *pVVar12;
  long *plVar13;
  long lVar14;
  ulong uVar15;
  undefined8 *puVar16;
  Vec2 VVar17;
  pointer pSVar18;
  size_type *psVar19;
  FT_Face_conflict pFVar20;
  Vec2 VVar21;
  uint number;
  int number_00;
  int number_01;
  int number_02;
  ulong uVar22;
  FT_Stroker pFVar23;
  undefined1 *puVar24;
  int *piVar25;
  float *pfVar26;
  pointer pfVar27;
  int iVar28;
  undefined1 local_1228 [4104];
  _Alloc_hider local_220;
  char local_210 [16];
  _Alloc_hider local_200;
  char local_1f0 [40];
  pointer local_1c8;
  _Alloc_hider local_1b0;
  char local_1a0 [24];
  undefined1 local_188 [8];
  string fileHash;
  FT_Stroker local_160;
  FT_Stroker stroker;
  FT_Glyph glyph;
  GLuint atlas;
  undefined1 local_140 [16];
  string *local_130;
  pointer pSStack_128;
  vector<Single,_std::allocator<Single>_> frags;
  string pathAndSize;
  string filename;
  FT_Glyph stroke;
  FT_Library local_b8;
  FT_Library library;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Vec2 local_88;
  Vec2 dims;
  FT_Face_conflict face;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  float local_34;
  
  pathAndSize.field_2._8_8_ = &filename._M_string_length;
  pcVar4 = (path->_M_dataplus)._M_p;
  path_00 = (string *)((long)&pathAndSize.field_2 + 8);
  local_34 = thickness;
  std::__cxx11::string::_M_construct<char*>
            ((string *)path_00,pcVar4,pcVar4 + path->_M_string_length);
  this->ln = -1.0;
  bVar9 = fileExists(path_00);
  if (bVar9) {
    FVar10 = FT_Init_FreeType(&local_b8);
    if (FVar10 != 0) {
      print("failure starting FreeType: FT_Init_FreeType");
      goto LAB_0019a74d;
    }
    FVar10 = FT_New_Face(local_b8,(char *)pathAndSize.field_2._8_8_,0,(FT_Face_conflict *)&dims);
    if (FVar10 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,"failure loading font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pathAndSize.field_2 + 8));
      pVVar12 = (Vec2 *)std::__cxx11::string::append
                                  ((char *)&frags.
                                            super__Vector_base<Single,_std::allocator<Single>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      VVar17 = (Vec2)(pVVar12 + 2);
      if (*pVVar12 == VVar17) {
        local_1228._16_8_ = *(undefined8 *)VVar17;
        local_1228._24_8_ = pVVar12[3];
        local_1228._0_8_ = (long)local_1228 + 0x10;
      }
      else {
        local_1228._16_8_ = *(undefined8 *)VVar17;
        local_1228._0_8_ = *pVVar12;
      }
      local_1228._8_8_ = pVVar12[1];
      *pVVar12 = VVar17;
      pVVar12[1].x = 0.0;
      pVVar12[1].y = 0.0;
      *(undefined1 *)&pVVar12[2].x = 0;
      print((string *)local_1228);
      if (local_1228._0_8_ != (long)local_1228 + 0x10) {
        operator_delete((void *)local_1228._0_8_);
      }
      if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)&pathAndSize._M_string_length) {
        operator_delete(frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      FT_Done_FreeType(local_b8);
      goto LAB_0019a74d;
    }
    unload(this);
    toStr_abi_cxx11_((string *)local_1228,(nite *)(ulong)size,number);
    plVar13 = (long *)std::__cxx11::string::replace
                                ((ulong)local_1228,0,(char *)0x0,(ulong)(path->_M_dataplus)._M_p);
    frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&pathAndSize._M_string_length;
    pSVar18 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pSVar18) {
      pathAndSize._M_string_length._0_4_ = pSVar18->w;
      pathAndSize._M_string_length._4_4_ = pSVar18->h;
      pathAndSize.field_2._M_allocated_capacity = plVar13[3];
    }
    else {
      pathAndSize._M_string_length._0_4_ = pSVar18->w;
      pathAndSize._M_string_length._4_4_ = pSVar18->h;
      frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar13;
    }
    pathAndSize._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)pSVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_1228._0_8_ != (long)local_1228 + 0x10) {
      operator_delete((void *)local_1228._0_8_);
    }
    local_130 = path;
    hashMemory_abi_cxx11_
              ((string *)local_188,
               (nite *)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,pathAndSize._M_dataplus._M_p,
               (size_t)pSVar18);
    pfVar7 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar27 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar22 = ((long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * 0x133f84cfe133f84d;
    stroke = (FT_Glyph)
             fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_1228._0_8_ = this;
    if (fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      library = (FT_Library)local_188;
      uVar15 = 0;
      do {
        iVar28 = (int)uVar15;
        if (((pointer)pfVar27[uVar15].hash._M_string_length == fileHash._M_dataplus._M_p) &&
           ((fileHash._M_dataplus._M_p == (pointer)0x0 ||
            (iVar11 = bcmp(pfVar27[uVar15].hash._M_dataplus._M_p,library,
                           (size_t)fileHash._M_dataplus._M_p), iVar11 == 0)))) {
          this->objectId = iVar28;
          if (iVar28 < 0) goto LAB_0019a867;
          iVar5._M_current =
               pfVar27[uVar15].owners.
               super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              pfVar27[uVar15].owners.super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nite::Font*,std::allocator<nite::Font*>>::_M_realloc_insert<nite::Font*>
                      ((vector<nite::Font*,std::allocator<nite::Font*>> *)&pfVar27[uVar15].owners,
                       iVar5,(Font **)local_1228);
          }
          else {
            *iVar5._M_current = this;
            pppFVar1 = &pfVar27[uVar15].owners.
                        super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
          }
          goto LAB_0019b6a2;
        }
        uVar15 = (ulong)(iVar28 + 1);
      } while (uVar15 <= uVar22 && uVar22 - uVar15 != 0);
    }
    this->objectId = -1;
LAB_0019a867:
    piVar25 = &this->objectId;
    if (pfVar7 != pfVar27) {
      uVar15 = 0;
      do {
        if (pfVar27[uVar15].empty != false) goto LAB_0019a90a;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (uVar15 <= uVar22 && uVar22 - uVar15 != 0);
    }
    fontT::fontT((fontT *)local_1228);
    std::vector<fontT,_std::allocator<fontT>_>::emplace_back<fontT>(&fontList,(fontT *)local_1228);
    if (local_1b0._M_p != local_1a0) {
      operator_delete(local_1b0._M_p);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if (local_200._M_p != local_1f0) {
      operator_delete(local_200._M_p);
    }
    if (local_220._M_p != local_210) {
      operator_delete(local_220._M_p);
    }
    uVar15 = uVar22 & 0xffffffff;
    pfVar27 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
              super__Vector_impl_data._M_start;
LAB_0019a90a:
    this->objectId = (int)uVar15;
    lVar14 = (long)(int)uVar15;
    pfVar27[lVar14].empty = false;
    iVar5._M_current =
         pfVar27[lVar14].owners.super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        pfVar27[lVar14].owners.super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nite::Font*,std::allocator<nite::Font*>>::_M_realloc_insert<nite::Font*>
                ((vector<nite::Font*,std::allocator<nite::Font*>> *)&pfVar27[lVar14].owners,iVar5,
                 (Font **)local_1228);
      lVar14 = (long)*piVar25;
    }
    else {
      *iVar5._M_current = this;
      pppFVar1 = &pfVar27[lVar14].owners.
                  super__Vector_base<nite::Font_*,_std::allocator<nite::Font_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    std::__cxx11::string::_M_assign
              ((string *)
               &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14].hash);
    std::__cxx11::string::_M_assign
              ((string *)
               &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar25].filename);
    pfVar27 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar28 = *piVar25;
    FVar10 = FT_Set_Char_Size((FT_Face)dims,(ulong)(size << 6),(ulong)(size << 6),0x60,0x60);
    if (FVar10 == 0) {
      if (0.0 < local_34) {
        FT_Stroker_New(local_b8,&local_160);
        FT_Stroker_Set(local_160,(long)(int)(local_34 * 64.0),FT_STROKER_LINECAP_ROUND,
                       FT_STROKER_LINEJOIN_ROUND,0);
      }
      pSStack_128 = (pointer)0x0;
      frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      Vec2::Vec2(&local_88);
      fileHash.field_2._8_8_ = pfVar27 + iVar28;
      pfVar26 = &pfVar27[iVar28].glyphs[0x20].index.y;
      library = (FT_Library)0x0;
      uVar22 = 0x20;
      do {
        VVar17 = (Vec2)((long)local_1228 + 0x10);
        glyph_index = FT_Get_Char_Index((FT_Face)dims,uVar22);
        FVar10 = FT_Load_Glyph((FT_Face)dims,glyph_index,0);
        if (FVar10 == 0) {
          FVar10 = FT_Get_Glyph(*(FT_GlyphSlot *)((long)dims + 0x98),(FT_Glyph *)&stroker);
          if (FVar10 == 0) {
            if (0.0 < local_34) {
              FVar10 = FT_Get_Glyph(*(FT_GlyphSlot *)((long)dims + 0x98),
                                    (FT_Glyph *)((long)&filename.field_2 + 8));
              if (FVar10 != 0) {
                toStr_abi_cxx11_((string *)&glyph,(nite *)(uVar22 & 0xffffffff),number_02);
                std::operator+(&local_a8,"failed to load char \'",(string *)&glyph);
                plVar13 = (long *)std::__cxx11::string::append((char *)&local_a8);
                face = (FT_Face_conflict)&local_68;
                pFVar20 = (FT_Face_conflict)(plVar13 + 2);
                if ((FT_Face_conflict)*plVar13 == pFVar20) {
                  local_68._M_allocated_capacity = pFVar20->num_faces;
                  local_68._8_8_ = plVar13[3];
                }
                else {
                  local_68._M_allocated_capacity = pFVar20->num_faces;
                  face = (FT_Face_conflict)*plVar13;
                }
                local_70 = plVar13[1];
                *plVar13 = (long)pFVar20;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                std::operator+(&local_58,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &face,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&pathAndSize.field_2 + 8));
                pVVar12 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
                VVar21 = (Vec2)(pVVar12 + 2);
                if (*pVVar12 == VVar21) {
                  local_1228._16_8_ = *(undefined8 *)VVar21;
                  local_1228._24_8_ = pVVar12[3];
                  local_1228._0_8_ = VVar17;
                }
                else {
                  local_1228._16_8_ = *(undefined8 *)VVar21;
                  local_1228._0_8_ = *pVVar12;
                }
                local_1228._8_8_ = pVVar12[1];
                *pVVar12 = VVar21;
                pVVar12[1].x = 0.0;
                pVVar12[1].y = 0.0;
                *(undefined1 *)&pVVar12[2].x = 0;
                print((string *)local_1228);
                if ((Vec2)local_1228._0_8_ != VVar17) {
                  operator_delete((void *)local_1228._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)face != &local_68) {
                  operator_delete(face);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p);
                }
                puVar24 = (undefined1 *)CONCAT44(glyph._4_4_,glyph._0_4_);
                if (puVar24 != local_140) goto LAB_0019afe5;
                goto LAB_0019afea;
              }
              FT_Glyph_StrokeBorder((FT_Glyph *)((long)&filename.field_2 + 8),local_160,'\0','\x01')
              ;
            }
            FT_Glyph_To_Bitmap((FT_Glyph *)&stroker,FT_RENDER_MODE_NORMAL,(FT_Vector *)0x0,'\x01');
            pFVar23 = stroker;
            if (0.0 < local_34) {
              FT_Glyph_To_Bitmap((FT_Glyph *)((long)&filename.field_2 + 8),FT_RENDER_MODE_NORMAL,
                                 (FT_Vector *)0x0,'\x01');
              stroke = (FT_Glyph)filename.field_2._8_8_;
            }
            local_1228._8_4_ = 0.0;
            local_1228._12_4_ = 0.0;
            if ((local_34 != 0.0) || (NAN(local_34))) {
              Single::strong((Single *)local_1228,*(int *)((long)&stroke[1].clazz + 4),
                             *(int *)&stroke[1].clazz,(uchar *)stroke[1].advance.x);
              Single::blitz((Single *)local_1228,*(int *)((long)&pFVar23->subpath_angle + 4),
                            (int)pFVar23->subpath_angle,(uchar *)(pFVar23->subpath_start).y);
            }
            else {
              Single::pure((Single *)local_1228,*(int *)((long)&pFVar23->subpath_angle + 4),
                           (int)pFVar23->subpath_angle,(uchar *)(pFVar23->subpath_start).y);
            }
            if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                super__Vector_impl_data._M_start ==
                frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<Single,std::allocator<Single>>::_M_realloc_insert<Single_const&>
                        ((vector<Single,std::allocator<Single>> *)&pSStack_128,
                         (iterator)
                         frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                         super__Vector_impl_data._M_start,(Single *)local_1228);
            }
            else {
              (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
               super__Vector_impl_data._M_start)->size = local_1228._16_8_;
              (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
               super__Vector_impl_data._M_start)->w = local_1228._0_4_;
              (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
               super__Vector_impl_data._M_start)->h = local_1228._4_4_;
              (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
               super__Vector_impl_data._M_start)->buffer = (uchar *)local_1228._8_8_;
              frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
              super__Vector_impl_data._M_start =
                   frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            if (local_34 != 0.0) {
              pFVar23 = (FT_Stroker)stroke;
            }
            if (NAN(local_34)) {
              pFVar23 = (FT_Stroker)stroke;
            }
            ((Vec2 *)(pfVar26 + -1))->x = (float)(int)library;
            *pfVar26 = 0.0;
            uVar2 = *(uint *)((long)&pFVar23->subpath_angle + 4);
            pfVar26[-7] = (float)uVar2;
            uVar3 = (uint)pFVar23->subpath_angle;
            pfVar26[-6] = (float)uVar3;
            iVar28._0_1_ = pFVar23->first_point;
            iVar28._1_1_ = pFVar23->subpath_open;
            iVar28._2_2_ = *(undefined2 *)&pFVar23->field_0x2a;
            pfVar26[-3] = (float)iVar28;
            pfVar26[-2] = (float)*(int *)&pFVar23->field_0x2c;
            lVar14 = *(long *)((long)dims + 0x98);
            pfVar26[-5] = (float)(*(long *)(lVar14 + 0x80) >> 6);
            pfVar26[-4] = (float)(*(long *)(lVar14 + 0x48) >> 6);
            local_88.x = (float)(uVar2 + 2) + local_88.x;
            uVar15 = (long)local_88.y & 0xffffffff;
            if ((uint)(long)local_88.y < uVar3) {
              uVar15 = (ulong)uVar3;
            }
            local_88.y = (float)uVar15;
            FT_Done_Glyph((FT_Glyph)stroker);
            if (0.0 < local_34) {
              FT_Done_Glyph((FT_Glyph)filename.field_2._8_8_);
            }
            library = (FT_Library)(ulong)((int)library + uVar2 + 2);
          }
          else {
            toStr_abi_cxx11_((string *)&glyph,(nite *)(uVar22 & 0xffffffff),number_01);
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&glyph,0,(char *)0x0,0x245270);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            psVar19 = puVar16 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar19) {
              local_a8.field_2._M_allocated_capacity = *psVar19;
              local_a8.field_2._8_8_ = puVar16[3];
            }
            else {
              local_a8.field_2._M_allocated_capacity = *psVar19;
              local_a8._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_a8._M_string_length = puVar16[1];
            *puVar16 = psVar19;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_a8);
            face = (FT_Face_conflict)&local_68;
            pFVar20 = (FT_Face_conflict)(plVar13 + 2);
            if ((FT_Face_conflict)*plVar13 == pFVar20) {
              local_68._M_allocated_capacity = pFVar20->num_faces;
              local_68._8_8_ = plVar13[3];
            }
            else {
              local_68._M_allocated_capacity = pFVar20->num_faces;
              face = (FT_Face_conflict)*plVar13;
            }
            local_70 = plVar13[1];
            *plVar13 = (long)pFVar20;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&face,pathAndSize.field_2._8_8_);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            psVar19 = puVar16 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar19) {
              local_58.field_2._M_allocated_capacity = *psVar19;
              local_58.field_2._8_8_ = puVar16[3];
            }
            else {
              local_58.field_2._M_allocated_capacity = *psVar19;
              local_58._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_58._M_string_length = puVar16[1];
            *puVar16 = psVar19;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            pVVar12 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
            VVar21 = (Vec2)(pVVar12 + 2);
            if (*pVVar12 == VVar21) {
              local_1228._16_8_ = *(undefined8 *)VVar21;
              local_1228._24_8_ = pVVar12[3];
              local_1228._0_8_ = VVar17;
            }
            else {
              local_1228._16_8_ = *(undefined8 *)VVar21;
              local_1228._0_8_ = *pVVar12;
            }
            local_1228._8_8_ = pVVar12[1];
            *pVVar12 = VVar21;
            pVVar12[1].x = 0.0;
            pVVar12[1].y = 0.0;
            *(undefined1 *)&pVVar12[2].x = 0;
            print((string *)local_1228);
            if ((Vec2)local_1228._0_8_ != VVar17) {
              operator_delete((void *)local_1228._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)face != &local_68) {
              operator_delete(face);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            puVar24 = (undefined1 *)CONCAT44(glyph._4_4_,glyph._0_4_);
            if (puVar24 != local_140) goto LAB_0019afe5;
          }
        }
        else {
          toStr_abi_cxx11_((string *)&glyph,(nite *)(uVar22 & 0xffffffff),number_00);
          plVar13 = (long *)std::__cxx11::string::replace((ulong)&glyph,0,(char *)0x0,0x245270);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_a8.field_2._M_allocated_capacity = *psVar19;
            local_a8.field_2._8_8_ = plVar13[3];
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar19;
            local_a8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_a8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_a8);
          face = (FT_Face_conflict)&local_68;
          pFVar20 = (FT_Face_conflict)(plVar13 + 2);
          if ((FT_Face_conflict)*plVar13 == pFVar20) {
            local_68._M_allocated_capacity = pFVar20->num_faces;
            local_68._8_8_ = plVar13[3];
          }
          else {
            local_68._M_allocated_capacity = pFVar20->num_faces;
            face = (FT_Face_conflict)*plVar13;
          }
          local_70 = plVar13[1];
          *plVar13 = (long)pFVar20;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::_M_append((char *)&face,pathAndSize.field_2._8_8_)
          ;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          psVar19 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_58.field_2._M_allocated_capacity = *psVar19;
            local_58.field_2._8_8_ = plVar13[3];
          }
          else {
            local_58.field_2._M_allocated_capacity = *psVar19;
            local_58._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_58._M_string_length = plVar13[1];
          *plVar13 = (long)psVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          pVVar12 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
          VVar21 = (Vec2)(pVVar12 + 2);
          if (*pVVar12 == VVar21) {
            local_1228._16_8_ = *(undefined8 *)VVar21;
            local_1228._24_8_ = pVVar12[3];
            local_1228._0_8_ = VVar17;
          }
          else {
            local_1228._16_8_ = *(undefined8 *)VVar21;
            local_1228._0_8_ = *pVVar12;
          }
          local_1228._8_8_ = pVVar12[1];
          *pVVar12 = VVar21;
          pVVar12[1].x = 0.0;
          pVVar12[1].y = 0.0;
          *(undefined1 *)&pVVar12[2].x = 0;
          print((string *)local_1228);
          if ((Vec2)local_1228._0_8_ != VVar17) {
            operator_delete((void *)local_1228._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)face != &local_68) {
            operator_delete(face);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          puVar24 = (undefined1 *)CONCAT44(glyph._4_4_,glyph._0_4_);
          if (puVar24 != local_140) {
LAB_0019afe5:
            operator_delete(puVar24);
          }
        }
LAB_0019afea:
        uVar22 = uVar22 + 1;
        pfVar26 = pfVar26 + 8;
      } while (uVar22 != 0x80);
      *(float *)(fileHash.field_2._8_8_ + 0x1058) =
           (float)(*(long *)(*(long *)((long)dims + 0xa0) + 0x40) >> 6);
      glEnable(0xde1);
      glGenTextures(1,&glyph);
      glBindTexture(0xde1,glyph._0_4_);
      glPixelStorei(0xcf5,1);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexImage2D(0xde1,0,0x1908,(int)local_88.x,(int)local_88.y,0,0x1908,0x1401,0);
      if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
          _M_start != pSStack_128) {
        uVar22 = 0;
        lVar14 = 8;
        iVar28 = 0;
        do {
          pSVar18 = pSStack_128;
          glTexSubImage2D(0xde1,0,iVar28,0,*(undefined4 *)((long)pSStack_128 + lVar14 + -8),
                          *(undefined4 *)((long)pSStack_128 + lVar14 + -4),0x1908,0x1401,
                          *(undefined8 *)((long)&pSStack_128->w + lVar14));
          iVar11 = *(int *)((long)pSVar18 + lVar14 + -8);
          pvVar6 = *(void **)((long)&pSVar18->w + lVar14);
          if (pvVar6 != (void *)0x0) {
            operator_delete(pvVar6);
          }
          iVar28 = iVar28 + iVar11 + 2;
          uVar22 = uVar22 + 1;
          uVar15 = ((long)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)pSStack_128 >> 3) *
                   -0x5555555555555555;
          lVar14 = lVar14 + 0x18;
        } while (uVar22 <= uVar15 && uVar15 - uVar22 != 0);
      }
      glPixelStorei(0xcf5,4);
      uVar8 = fileHash.field_2._8_8_;
      std::__cxx11::string::_M_assign((string *)(fileHash.field_2._8_8_ + 0x1028));
      *(ulong *)(uVar8 + 0x104c) = CONCAT44(local_88.y,local_88.x);
      std::__cxx11::string::_M_assign((string *)(uVar8 + 0x1008));
      *(uint *)(uVar8 + 0x1048) = size;
      *(undefined1 *)(uVar8 + 0x1054) = 0;
      *(undefined4 *)(uVar8 + 0x1000) = glyph._0_4_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&face,
                     "loaded font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pathAndSize.field_2 + 8));
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&face);
      psVar19 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_58.field_2._M_allocated_capacity = *psVar19;
        local_58.field_2._8_8_ = puVar16[3];
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar19;
        local_58._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_58._M_string_length = puVar16[1];
      *puVar16 = psVar19;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      toStr_abi_cxx11_(&local_a8,(nite *)(ulong)size,(uint)local_58._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1228
                     ,&local_58,&local_a8);
      print((string *)local_1228);
      if (local_1228._0_8_ != (long)local_1228 + 0x10) {
        operator_delete((void *)local_1228._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)face != &local_68) {
        operator_delete(face);
      }
      if (0.0 < local_34) {
        FT_Stroker_Done(local_160);
      }
      FT_Done_Face((FT_Face)dims);
      FT_Done_FreeType(local_b8);
      if (pSStack_128 != (pointer)0x0) {
        operator_delete(pSStack_128);
      }
    }
    else {
      std::operator+(&local_58,"failure loading font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pathAndSize.field_2 + 8));
      pVVar12 = (Vec2 *)std::__cxx11::string::append((char *)&local_58);
      VVar17 = (Vec2)(pVVar12 + 2);
      if (*pVVar12 == VVar17) {
        local_1228._16_8_ = *(undefined8 *)VVar17;
        local_1228._24_8_ = pVVar12[3];
        local_1228._0_8_ = (long)local_1228 + 0x10;
      }
      else {
        local_1228._16_8_ = *(undefined8 *)VVar17;
        local_1228._0_8_ = *pVVar12;
      }
      local_1228._8_8_ = pVVar12[1];
      *pVVar12 = VVar17;
      pVVar12[1].x = 0.0;
      pVVar12[1].y = 0.0;
      *(undefined1 *)&pVVar12[2].x = 0;
      print((string *)local_1228);
      if (local_1228._0_8_ != (long)local_1228 + 0x10) {
        operator_delete((void *)local_1228._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      FT_Done_FreeType(local_b8);
    }
LAB_0019b6a2:
    if (local_188 != (undefined1  [8])&fileHash._M_string_length) {
      operator_delete((void *)local_188);
    }
    if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage == (pointer)&pathAndSize._M_string_length) goto LAB_0019a74d;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"couldn\'t load font \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pathAndSize.field_2 + 8));
    pVVar12 = (Vec2 *)std::__cxx11::string::append
                                ((char *)&frags.super__Vector_base<Single,_std::allocator<Single>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    VVar17 = (Vec2)(pVVar12 + 2);
    if (*pVVar12 == VVar17) {
      local_1228._16_8_ = *(undefined8 *)VVar17;
      local_1228._24_8_ = pVVar12[3];
      local_1228._0_8_ = (long)local_1228 + 0x10;
    }
    else {
      local_1228._16_8_ = *(undefined8 *)VVar17;
      local_1228._0_8_ = *pVVar12;
    }
    local_1228._8_8_ = pVVar12[1];
    *pVVar12 = VVar17;
    pVVar12[1].x = 0.0;
    pVVar12[1].y = 0.0;
    *(undefined1 *)&pVVar12[2].x = 0;
    print((string *)local_1228);
    if (local_1228._0_8_ != (long)local_1228 + 0x10) {
      operator_delete((void *)local_1228._0_8_);
    }
    if (frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage == (pointer)&pathAndSize._M_string_length) goto LAB_0019a74d;
  }
  operator_delete(frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
LAB_0019a74d:
  if ((size_type *)pathAndSize.field_2._8_8_ != &filename._M_string_length) {
    operator_delete((void *)pathAndSize.field_2._8_8_);
  }
  return;
}

Assistant:

void nite::Font::load(const String &path, unsigned size, float thickness){
	FT_Library library;
	FT_Face face;
	String filename = path;
	size *= SCALING;
	ln = -1.0f;

	if(!nite::fileExists(filename)){
		nite::print("couldn't load font '"+filename+"': doesn't exist");
		return;
	}

	if(FT_Init_FreeType(&library)){
		nite::print("failure starting FreeType: FT_Init_FreeType");
		return;
	}

	if(FT_New_Face(library, filename.c_str(), 0, &face)) {
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);
		return;
	}	

	unload();
	String pathAndSize = path+nite::toStr(size);
	String fileHash = nite::hashMemory((char*)pathAndSize.c_str(), pathAndSize.size());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		fontList[objectId].empty = false;
		fontList[objectId].owners.push_back(this);
		fontList[objectId].hash = fileHash;
    	fontList[objectId].filename = path;
	}else{
		fontList[objectId].owners.push_back(this);
		return;
	}
	fontT &proxy = fontList[objectId];


	if(FT_Set_Char_Size(face, size << 6, size << 6, 96, 96)){
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);		
		return;
	}

	FT_Stroker stroker;
	if(thickness > 0.0f){
		FT_Stroker_New(library, &stroker);
		FT_Stroker_Set(stroker, (int)(thickness * 64.0f), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
	}
	Vector<Single> frags; // maybe a vector could be too slow?
	nite::Vec2 dims;
	int xcursor = 0.0f;
	// render characters
	for(int i = ASCII_MIN; i < ASCII_MAX; i++){
		FT_UInt cindex = FT_Get_Char_Index(face, i);
		FT_Glyph glyph, stroke;
		if(FT_Load_Glyph(face, cindex, FT_LOAD_DEFAULT)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(FT_Get_Glyph(face->glyph, &glyph)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(thickness > 0.0f){
			if(FT_Get_Glyph(face->glyph, &stroke)){
				nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
				continue;
			}		
			// stroke
			FT_Glyph_StrokeBorder(&stroke, stroker, 0, 1);			
		}
		// render to bitmap
		FT_Glyph_To_Bitmap(&glyph, FT_RENDER_MODE_NORMAL, NULL, true);
		FT_BitmapGlyph bitmap = reinterpret_cast<FT_BitmapGlyph>(glyph);
		FT_BitmapGlyph bitmapStroke;
		if(thickness > 0.0f){
			FT_Glyph_To_Bitmap(&stroke, FT_RENDER_MODE_NORMAL, NULL, true);
			bitmapStroke = reinterpret_cast<FT_BitmapGlyph>(stroke);
		}
		
		Single buffer;

		// render filler alone
		if(thickness == 0.0f){
			buffer = Single();
			buffer.pure(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);
		// render outline as a strong and blit on it the filler
		}else{
			buffer = Single();
			buffer.strong(bitmapStroke->bitmap.width, bitmapStroke->bitmap.rows, bitmapStroke->bitmap.buffer);
			buffer.blitz(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);		
		}

		frags.push_back(buffer);
		auto biggest = thickness == 0.0f ? bitmap : bitmapStroke;

		// metrics
		proxy.glyphs[i].index.x = xcursor;
		proxy.glyphs[i].index.y = 0;
		proxy.glyphs[i].coors.x = biggest->bitmap.width;
		proxy.glyphs[i].coors.y = biggest->bitmap.rows;
		proxy.glyphs[i].orig.x = biggest->left;
		proxy.glyphs[i].orig.y = biggest->top; 
		proxy.glyphs[i].size.x = face->glyph->advance.x >> 6;
		proxy.glyphs[i].size.y = face->glyph->metrics.horiBearingY >> 6;
		// atlas info
		dims.x += biggest->bitmap.width + 2;
		dims.y = std::max((unsigned)dims.y, biggest->bitmap.rows);
		// cursor update
		xcursor += biggest->bitmap.width + 2;
		FT_Done_Glyph(glyph);
		if(thickness > 0.0f){
			FT_Done_Glyph(stroke);
		}
	}
	proxy.vertAdvance = face->size->metrics.height >> 6;

	// compose atlas
	// TODO: might use a more complex algorithm than just a very long texture
	// specially if we ever get to implement unicode
	GLuint atlas;
	glEnable(GL_TEXTURE_2D);
	glGenTextures(1, &atlas);
	glBindTexture(GL_TEXTURE_2D, atlas);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);	
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, dims.x, dims.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);	
	xcursor = 0;
	for(int i = 0; i < frags.size(); ++i){
		auto &frag = frags[i];
		glTexSubImage2D(GL_TEXTURE_2D, 0, xcursor, 0, frag.w, frag.h, GL_RGBA, GL_UNSIGNED_BYTE, frag.buffer);
		xcursor += frag.w + 2;
		frag.clear();
	}
	glPixelStorei(GL_UNPACK_ALIGNMENT, 4);
	// finish up
	proxy.hash = fileHash;
	proxy.atlasSize = dims;
	proxy.path = path;
	proxy.size = size;
	proxy.empty = false;
	proxy.atlas = atlas;

	nite::print("loaded font '"+filename+"' size: "+nite::toStr(size));

	// clean up
	if(thickness > 0.0f){
		FT_Stroker_Done(stroker);
	}
	FT_Done_Face(face);
	FT_Done_FreeType(library);
}